

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall Highs::getColName(Highs *this,HighsInt col,string *name)

{
  char *format;
  
  if (col < 0 || (this->model_).lp_.num_col_ <= col) {
    format = "Index %d for column name is outside the range [0, num_col = %d)\n";
  }
  else {
    if (col < (int)((ulong)((long)(this->model_).lp_.col_names_.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->model_).lp_.col_names_.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
      std::__cxx11::string::_M_assign((string *)name);
      return kOk;
    }
    format = "Index %d for column name is outside the range [0, num_col_name = %d)\n";
  }
  highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,format);
  return kError;
}

Assistant:

HighsStatus Highs::getColName(const HighsInt col, std::string& name) const {
  const HighsInt num_col = this->model_.lp_.num_col_;
  if (col < 0 || col >= num_col) {
    highsLogUser(
        options_.log_options, HighsLogType::kError,
        "Index %d for column name is outside the range [0, num_col = %d)\n",
        int(col), int(num_col));
    return HighsStatus::kError;
  }
  const HighsInt num_col_name = this->model_.lp_.col_names_.size();
  if (col >= num_col_name) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Index %d for column name is outside the range [0, "
                 "num_col_name = %d)\n",
                 int(col), int(num_col_name));
    return HighsStatus::kError;
  }
  name = this->model_.lp_.col_names_[col];
  return HighsStatus::kOk;
}